

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyStamp.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBodyStamp::RigidBodyStamp(RigidBodyStamp *this,int index)

{
  undefined4 in_ESI;
  undefined8 *in_RDI;
  DataHolder *in_stack_ffffffffffffff80;
  value_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_31 [49];
  
  local_31._37_4_ = in_ESI;
  DataHolder::DataHolder(in_stack_ffffffffffffff80);
  *in_RDI = &PTR__RigidBodyStamp_00341628;
  *(undefined4 *)(in_RDI + 0xd) = local_31._37_4_;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2994d9);
  __x = (value_type *)(in_RDI + 7);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,__x);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

RigidBodyStamp::RigidBodyStamp(int index) : index_(index) {
    deprecatedKeywords_.insert("nMembers");
  }